

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

char * varinfo(lua_State *L,TValue *o)

{
  CallInfo *pCVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  int reg;
  StkId pSVar5;
  long lVar6;
  char *local_10;
  
  pCVar1 = L->ci;
  local_10 = (char *)0x0;
  if ((pCVar1->callstatus & 2) == 0) {
    lVar2 = *(long *)(pCVar1->func).p;
    if (*(byte *)(lVar2 + 10) != 0) {
      lVar6 = 0;
      do {
        if (*(TValue **)(*(long *)(lVar2 + 0x20 + lVar6) + 0x10) == o) {
          lVar2 = *(long *)(*(long *)(*(long *)(lVar2 + 0x18) + 0x50) + lVar6 * 2);
          pcVar4 = "?";
          if (lVar2 != 0) {
            pcVar4 = (char *)(lVar2 + 0x18);
          }
          pcVar3 = "upvalue";
          goto LAB_001110e2;
        }
        lVar6 = lVar6 + 8;
      } while ((ulong)*(byte *)(lVar2 + 10) * 8 != lVar6);
    }
    pSVar5 = (pCVar1->func).p + 1;
    if (pSVar5 < (pCVar1->top).p) {
      reg = 0;
      do {
        if (pSVar5 == (StkId)o) {
          pcVar3 = getobjname(*(Proto **)(lVar2 + 0x18),
                              (int)((ulong)((long)(pCVar1->u).l.savedpc -
                                           (long)(*(Proto **)(lVar2 + 0x18))->code) >> 2) + -1,reg,
                              &local_10);
          pcVar4 = local_10;
          if (pcVar3 != (char *)0x0) {
LAB_001110e2:
            pcVar4 = luaO_pushfstring(L," (%s \'%s\')",pcVar3,pcVar4);
            return pcVar4;
          }
          break;
        }
        reg = reg + 1;
        pSVar5 = pSVar5 + 1;
      } while (pSVar5 < (pCVar1->top).p);
    }
  }
  return "";
}

Assistant:

static const char *varinfo (lua_State *L, const TValue *o) {
  CallInfo *ci = L->ci;
  const char *name = NULL;  /* to avoid warnings */
  const char *kind = NULL;
  if (isLua(ci)) {
    kind = getupvalname(ci, o, &name);  /* check whether 'o' is an upvalue */
    if (!kind) {  /* not an upvalue? */
      int reg = instack(ci, o);  /* try a register */
      if (reg >= 0)  /* is 'o' a register? */
        kind = getobjname(ci_func(ci)->p, currentpc(ci), reg, &name);
    }
  }
  return formatvarinfo(L, kind, name);
}